

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::ModelExtractor::extractModel<Person>(ModelExtractor *this,shared_connection *_con)

{
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *obj;
  bean_key local_70;
  shared_res<hiberlite::autoclosed_con> local_48;
  undefined1 local_38 [8];
  bean_key key;
  Person *bean;
  shared_connection *_con_local;
  ModelExtractor *this_local;
  
  construct<hiberlite::ModelExtractor,Person>(this,(Person **)&key.con.res,0);
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_48,_con);
  bean_key::bean_key((bean_key *)local_38,&local_48,-1);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_48);
  obj = key.con.res;
  bean_key::bean_key(&local_70,(bean_key *)local_38);
  AVisitor<hiberlite::ExtractModel>::startWalk<Person>
            (&this->super_AVisitor<hiberlite::ExtractModel>,(Person *)obj,&local_70);
  bean_key::~bean_key(&local_70);
  destroy<hiberlite::ModelExtractor,Person>(this,(Person *)key.con.res,0);
  bean_key::~bean_key((bean_key *)local_38);
  return;
}

Assistant:

void ModelExtractor::extractModel(shared_connection _con)
{
	C* bean;
	construct(*this, &bean, static_cast<unsigned int>(0));
	bean_key key(_con, Database::NULL_ID);
	startWalk(*bean, key);
	destroy(*this, bean, static_cast<unsigned int>(0));
}